

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gensprep.c
# Opt level: O2

void strprepProfileLineFn
               (void *context,char *(*fields) [2],int32_t fieldCount,UErrorCode *pErrorCode)

{
  FILE *pFVar1;
  int iVar2;
  int32_t length;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  UStringPrepType type;
  int iVar6;
  UErrorCode UVar7;
  char *__haystack;
  uint32_t rangeEnd;
  uint32_t rangeStart;
  ulong local_e8;
  char *end;
  uint32_t mapping [40];
  
  rangeStart = 0;
  rangeEnd = 0;
  pcVar3 = u_skipWhitespace((*fields)[0]);
  if (*pcVar3 == '@') {
    pcVar3 = pcVar3 + 1;
    iVar6 = *(int *)(*fields + 1) - (int)pcVar3;
    if (8 < iVar6) {
      iVar2 = strncmp(pcVar3,"normalize",9);
      if (iVar2 == 0) {
        options[8].doesOccur = '\x01';
        return;
      }
      if ((iVar6 != 9) && (iVar6 = strncmp(pcVar3,"check-bidi",10), iVar6 == 0)) {
        options[10].doesOccur = '\x01';
        return;
      }
    }
    fprintf(_stderr,"gensprep error parsing a directive %s.",(*fields)[0]);
  }
  pcVar5 = fields[1][0];
  __haystack = fields[2][0];
  pcVar4 = strstr(__haystack,"UNASSIGNED");
  if (pcVar4 == (char *)0x0) {
    pcVar4 = strstr(__haystack,"PROHIBITED");
    if (pcVar4 != (char *)0x0) {
      u_parseCodePointRange(pcVar3,&rangeStart,&rangeEnd,pErrorCode);
      UVar7 = *pErrorCode;
      if (U_ZERO_ERROR < UVar7) goto LAB_00109c13;
      type = USPREP_PROHIBITED;
      goto LAB_00109b78;
    }
    pcVar4 = strstr(__haystack,"MAP");
    if (pcVar4 == (char *)0x0) {
      *pErrorCode = U_INVALID_FORMAT_ERROR;
      UVar7 = U_INVALID_FORMAT_ERROR;
      goto LAB_00109c3f;
    }
    local_e8 = strtoul(pcVar3,&end,0x10);
    if ((end <= pcVar3) || (end != (*fields)[1])) {
      fprintf(_stderr,"gensprep: syntax error in field 0 at %s\n",(*fields)[0]);
      *pErrorCode = U_PARSE_ERROR;
      exit(9);
    }
    length = u_parseCodePoints(pcVar5,mapping,0x28,pErrorCode);
    storeMapping((uint32_t)local_e8,mapping,length,USPREP_MAP,pErrorCode);
  }
  else {
    u_parseCodePointRange(pcVar3,&rangeStart,&rangeEnd,pErrorCode);
    UVar7 = *pErrorCode;
    if (U_ZERO_ERROR < UVar7) {
LAB_00109c13:
      pFVar1 = _stderr;
      pcVar3 = u_errorName_63(UVar7);
      fprintf(pFVar1,"Could not parse code point range. Error: %s\n",pcVar3);
      return;
    }
    type = USPREP_UNASSIGNED;
LAB_00109b78:
    storeRange(rangeStart,rangeEnd,type,pErrorCode);
  }
  UVar7 = *pErrorCode;
  if (UVar7 < U_ILLEGAL_ARGUMENT_ERROR) {
    return;
  }
  __haystack = fields[2][0];
LAB_00109c3f:
  pFVar1 = _stderr;
  pcVar3 = (*fields)[0];
  pcVar5 = u_errorName_63(UVar7);
  fprintf(pFVar1,"gensprep error parsing  %s line %s at %s. Error: %s\n",context,pcVar3,__haystack,
          pcVar5);
  exit(*pErrorCode);
}

Assistant:

static void U_CALLCONV
strprepProfileLineFn(void *context,
              char *fields[][2], int32_t fieldCount,
              UErrorCode *pErrorCode) {
    uint32_t mapping[40];
    char *end, *map;
    uint32_t code;
    int32_t length;
   /*UBool* mapWithNorm = (UBool*) context;*/
    const char* typeName;
    uint32_t rangeStart=0,rangeEnd =0;
    const char* filename = (const char*) context;
    const char *s;

    s = u_skipWhitespace(fields[0][0]);
    if (*s == '@') {
        /* special directive */
        s++;
        length = (int32_t)(fields[0][1] - s);
        if (length >= NORMALIZE_DIRECTIVE_LEN
            && uprv_strncmp(s, NORMALIZE_DIRECTIVE, NORMALIZE_DIRECTIVE_LEN) == 0) {
            options[NORMALIZE].doesOccur = TRUE;
            return;
        }
        else if (length >= CHECK_BIDI_DIRECTIVE_LEN
            && uprv_strncmp(s, CHECK_BIDI_DIRECTIVE, CHECK_BIDI_DIRECTIVE_LEN) == 0) {
            options[CHECK_BIDI].doesOccur = TRUE;
            return;
        }
        else {
            fprintf(stderr, "gensprep error parsing a directive %s.", fields[0][0]);
        }
    }

    typeName = fields[2][0];
    map = fields[1][0];

    if(uprv_strstr(typeName, usprepTypeNames[USPREP_UNASSIGNED])!=NULL){

        u_parseCodePointRange(s, &rangeStart,&rangeEnd, pErrorCode);
        if(U_FAILURE(*pErrorCode)){
            fprintf(stderr, "Could not parse code point range. Error: %s\n",u_errorName(*pErrorCode));
            return;
        }

        /* store the range */
        storeRange(rangeStart,rangeEnd,USPREP_UNASSIGNED, pErrorCode);

    }else if(uprv_strstr(typeName, usprepTypeNames[USPREP_PROHIBITED])!=NULL){

        u_parseCodePointRange(s, &rangeStart,&rangeEnd, pErrorCode);
        if(U_FAILURE(*pErrorCode)){
            fprintf(stderr, "Could not parse code point range. Error: %s\n",u_errorName(*pErrorCode));
            return;
        }

        /* store the range */
        storeRange(rangeStart,rangeEnd,USPREP_PROHIBITED, pErrorCode);

    }else if(uprv_strstr(typeName, usprepTypeNames[USPREP_MAP])!=NULL){

        /* get the character code, field 0 */
        code=(uint32_t)uprv_strtoul(s, &end, 16);
        if(end<=s || end!=fields[0][1]) {
            fprintf(stderr, "gensprep: syntax error in field 0 at %s\n", fields[0][0]);
            *pErrorCode=U_PARSE_ERROR;
            exit(U_PARSE_ERROR);
        }

        /* parse the mapping string */
        length=u_parseCodePoints(map, mapping, sizeof(mapping)/4, pErrorCode);
        
        /* store the mapping */
        storeMapping(code,mapping, length,USPREP_MAP, pErrorCode);

    }else{
        *pErrorCode = U_INVALID_FORMAT_ERROR;
    }
    
    if(U_FAILURE(*pErrorCode)) {
        fprintf(stderr, "gensprep error parsing  %s line %s at %s. Error: %s\n",filename,
               fields[0][0],fields[2][0],u_errorName(*pErrorCode));
        exit(*pErrorCode);
    }

}